

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

AnyCellmlElementPtr __thiscall libcellml::Annotator::item(Annotator *this,string *id)

{
  bool bVar1;
  AnnotatorImpl *pAVar2;
  reference __r;
  string *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  AnyCellmlElementPtr AVar4;
  vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
  local_38;
  string *local_20;
  string *id_local;
  Annotator *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  
  local_20 = in_RDX;
  id_local = id;
  this_local = this;
  pAVar2 = pFunc((Annotator *)id);
  AnnotatorImpl::update(pAVar2);
  pAVar2 = pFunc((Annotator *)id);
  bVar1 = AnnotatorImpl::exists(pAVar2,local_20,0,true);
  if (bVar1) {
    items(&local_38,(Annotator *)id,local_20);
    __r = std::
          vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
          ::operator[](&local_38,0);
    std::shared_ptr<libcellml::AnyCellmlElement>::shared_ptr
              ((shared_ptr<libcellml::AnyCellmlElement> *)this,__r);
    std::
    vector<std::shared_ptr<libcellml::AnyCellmlElement>,_std::allocator<std::shared_ptr<libcellml::AnyCellmlElement>_>_>
    ::~vector(&local_38);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    AVar4 = AnyCellmlElement::AnyCellmlElementImpl::create();
    _Var3 = AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  }
  AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var3._M_pi;
  AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnyCellmlElementPtr)
         AVar4.super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnyCellmlElementPtr Annotator::item(const std::string &id)
{
    pFunc()->update();
    return pFunc()->exists(id, 0, true) ? std::move(items(id)[0]) : AnyCellmlElement::AnyCellmlElementImpl::create();
}